

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,NodeRef *args,uint *args_1)

{
  uint uVar1;
  size_type sVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  pointer pEVar8;
  pointer pEVar9;
  pointer pEVar10;
  pointer pEVar11;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar12;
  long lVar13;
  pointer pEVar14;
  
  pEVar11 = this->data_;
  sVar2 = this->len;
  pEVar14 = pEVar11 + sVar2;
  if (sVar2 != this->cap) {
    uVar3 = (args->pip).value;
    uVar1 = *args_1;
    pEVar14->node = (void *)(uVar3 & 0xffffffffffffffc0);
    pEVar14->size = ((uint)uVar3 & 0x3f) + 1;
    pEVar14->offset = uVar1;
    this->len = sVar2 + 1;
    return pEVar11 + sVar2;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar12 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar12 < ctx) {
    pEVar12 = ctx;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    pEVar12 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar13 = (long)pEVar14 - (long)this->data_;
  pEVar8 = (pointer)operator_new((long)pEVar12 << 4);
  uVar3 = (args->pip).value;
  uVar1 = *args_1;
  *(ulong *)((long)pEVar8 + lVar13) = uVar3 & 0xffffffffffffffc0;
  *(uint *)((long)pEVar8 + lVar13 + 8) = ((uint)uVar3 & 0x3f) + 1;
  *(uint *)((long)pEVar8 + lVar13 + 0xc) = uVar1;
  pEVar11 = this->data_;
  pEVar9 = pEVar11 + this->len;
  pEVar10 = pEVar8;
  if (pEVar9 == pEVar14) {
    for (; pEVar11 != pEVar14; pEVar11 = pEVar11 + 1) {
      uVar6 = pEVar11->size;
      uVar7 = pEVar11->offset;
      pEVar10->node = pEVar11->node;
      pEVar10->size = uVar6;
      pEVar10->offset = uVar7;
      pEVar10 = pEVar10 + 1;
    }
  }
  else {
    for (; pEVar11 != pEVar14; pEVar11 = pEVar11 + 1) {
      uVar6 = pEVar11->size;
      uVar7 = pEVar11->offset;
      pEVar10->node = pEVar11->node;
      pEVar10->size = uVar6;
      pEVar10->offset = uVar7;
      pEVar10 = pEVar10 + 1;
    }
    puVar4 = (undefined8 *)((long)pEVar8 + lVar13);
    for (; pEVar14 != pEVar9; pEVar14 = pEVar14 + 1) {
      uVar5 = *(undefined8 *)&pEVar14->size;
      puVar4[2] = pEVar14->node;
      puVar4[3] = uVar5;
      puVar4 = puVar4 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar12;
  this->data_ = pEVar8;
  return (reference)((long)pEVar8 + lVar13);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }